

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putcontig8bitCIELab8
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint32_t g;
  float Y;
  float X;
  uint32_t local_58;
  uint32_t local_54;
  uint local_50;
  float local_4c;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  
  local_40 = (long)(fromskew * 3);
  local_38 = (long)toskew * -4;
  while (bVar3 = h != 0, h = h - 1, bVar3) {
    lVar1 = local_38;
    for (lVar2 = 0; w != (uint32_t)lVar2; lVar2 = lVar2 + 1) {
      TIFFCIELabToXYZ(img->cielab,(uint)*pp,(int)(char)pp[1],(int)(char)pp[2],&local_44,&local_48,
                      &local_4c);
      TIFFXYZToRGB(img->cielab,local_44,local_48,local_4c,&local_50,&local_54,&local_58);
      cp[lVar2] = local_54 << 8 | local_50 | local_58 << 0x10 | 0xff000000;
      pp = pp + 3;
      lVar1 = lVar1 + -4;
    }
    cp = (uint32_t *)((long)cp - lVar1);
    pp = pp + local_40;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitCIELab8)
{
    float X, Y, Z;
    uint32_t r, g, b;
    (void)y;
    fromskew *= 3;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            TIFFCIELabToXYZ(img->cielab, (unsigned char)pp[0],
                            (signed char)pp[1], (signed char)pp[2], &X, &Y, &Z);
            TIFFXYZToRGB(img->cielab, X, Y, Z, &r, &g, &b);
            *cp++ = PACK(r, g, b);
            pp += 3;
        }
        cp += toskew;
        pp += fromskew;
    }
}